

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O1

int cmd_setsaneconfig(char *args)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 uVar7;
  
  pcVar4 = strchr(args,0x20);
  *pcVar4 = '\0';
  pcVar5 = strchr(pcVar4 + 1,0x20);
  *pcVar5 = '\0';
  pcVar5 = pcVar5 + 1;
  pcVar6 = strchr(pcVar5,0x20);
  *pcVar6 = '\0';
  iVar1 = atoi(pcVar5);
  iVar2 = atoi(pcVar6 + 1);
  iVar3 = strcmp(pcVar5,"!");
  pcVar6 = (char *)0x0;
  if (iVar3 != 0) {
    pcVar6 = pcVar5;
  }
  iVar1 = PHYSFS_setSaneConfig(args,pcVar4 + 1,pcVar6,iVar1,iVar2);
  if (iVar1 == 0) {
    uVar7 = PHYSFS_getLastError();
    printf("Failure. reason: %s.\n",uVar7);
  }
  else {
    puts("Successful.");
  }
  return 1;
}

Assistant:

static int cmd_setsaneconfig(char *args)
{
    char *org;
    char *appName;
    char *arcExt;
    int inclCD;
    int arcsFirst;
    char *ptr = args;

        /* ugly. */
    org = ptr;
    ptr = strchr(ptr, ' '); *ptr = '\0'; ptr++; appName = ptr;
    ptr = strchr(ptr, ' '); *ptr = '\0'; ptr++; arcExt = ptr;
    ptr = strchr(ptr, ' '); *ptr = '\0'; ptr++; inclCD = atoi(arcExt);
    arcsFirst = atoi(ptr);

    if (strcmp(arcExt, "!") == 0)
        arcExt = NULL;

    if (PHYSFS_setSaneConfig(org, appName, arcExt, inclCD, arcsFirst))
        printf("Successful.\n");
    else
        printf("Failure. reason: %s.\n", PHYSFS_getLastError());

    return 1;
}